

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O2

int __thiscall TPZFrontSym<float>::Local(TPZFrontSym<float> *this,int64_t global)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  
  plVar2 = (this->super_TPZFront<float>).fLocal.fStore;
  lVar3 = plVar2[global];
  if (lVar3 == -1) {
    if ((this->super_TPZFront<float>).fFree.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements
        == 0) {
      lVar3 = (this->super_TPZFront<float>).fFront;
      (this->super_TPZFront<float>).fFront = lVar3 + 1;
    }
    else {
      iVar1 = TPZStack<int,_10>::Pop(&(this->super_TPZFront<float>).fFree);
      lVar3 = (long)iVar1;
      plVar2 = (this->super_TPZFront<float>).fLocal.fStore;
    }
    plVar2[global] = lVar3;
    if ((this->super_TPZFront<float>).fMaxFront <= lVar3) {
      Expand(this,(this->super_TPZFront<float>).fExpandRatio + (int)lVar3);
    }
    if ((this->super_TPZFront<float>).fGlobal.super_TPZVec<long>.fNElements <= lVar3) {
      TPZManVector<long,_10>::Resize(&(this->super_TPZFront<float>).fGlobal,lVar3 + 1);
    }
    (this->super_TPZFront<float>).fGlobal.super_TPZVec<long>.fStore[lVar3] = global;
  }
  return (int)lVar3;
}

Assistant:

void TPZFrontSym<std::complex<long double> >::DecomposeOneEquation(int64_t ieq, TPZEqnArray<std::complex<long double> > &eqnarray)
{
	DebugStop();
}